

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

AggregateFunction *
duckdb::ListContinuousQuantile::GetFunction<duckdb::timestamp_t,duckdb::timestamp_t>
          (LogicalType *input_type,LogicalType *target_type)

{
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  LogicalType *in_stack_000000e0;
  LogicalType *in_stack_000000e8;
  AggregateFunction *pAVar1;
  
  pAVar1 = in_RDI;
  QuantileListAggregate<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t,duckdb::list_entry_t,duckdb::QuantileListOperation<duckdb::timestamp_t,false>>
            (in_stack_000000e8,in_stack_000000e0);
  in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
  in_RDI->window =
       QuantileListOperation<duckdb::timestamp_t,false>::
       Window<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t,duckdb::list_entry_t>
  ;
  in_RDI->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t>
  ;
  return pAVar1;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &input_type, const LogicalType &target_type) {
		using STATE = QuantileState<INPUT_TYPE, QuantileStandardType>;
		using OP = QuantileListOperation<TARGET_TYPE, false>;
		auto fun = QuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(input_type, target_type);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::template Window<STATE, INPUT_TYPE, list_entry_t>;
		fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}